

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstree.cpp
# Opt level: O3

bool __thiscall search::BSTNode::erase(BSTNode *this,int key,Record **r)

{
  int iVar1;
  int key_00;
  BSTNode *pBVar2;
  BSTNode *pBVar3;
  Record *r1;
  Record *local_30;
  
  do {
    iVar1 = this->key_;
    if (iVar1 == key) {
      *r = this->record_;
      pBVar3 = this->left_;
      pBVar2 = this->right_;
      if (pBVar3 == (BSTNode *)0x0) {
        pBVar3 = this->parent_;
        if (pBVar2 == (BSTNode *)0x0) {
          (&pBVar3->left_)[pBVar3->key_ < key] = (BSTNode *)0x0;
        }
        else {
          if (pBVar3->key_ < key) {
            pBVar3->right_ = pBVar2;
            pBVar2 = this->right_;
          }
          else {
            pBVar3->left_ = pBVar2;
          }
          pBVar2->parent_ = pBVar3;
        }
      }
      else {
        if (pBVar2 != (BSTNode *)0x0) goto LAB_001067db;
        pBVar2 = this->parent_;
        if (pBVar2->key_ < key) {
          pBVar2->right_ = pBVar3;
        }
        else {
          pBVar2->left_ = pBVar3;
          pBVar3 = this->left_;
        }
        pBVar3->parent_ = pBVar2;
      }
      operator_delete(this,0x28);
      break;
    }
    this = (&this->left_)[iVar1 < key];
  } while (this != (BSTNode *)0x0);
LAB_0010686a:
  return iVar1 == key;
LAB_001067db:
  do {
    pBVar3 = pBVar2;
    pBVar2 = pBVar3->left_;
  } while (pBVar2 != (BSTNode *)0x0);
  local_30 = (Record *)0x0;
  key_00 = pBVar3->key_;
  erase(this,key_00,&local_30);
  this->key_ = key_00;
  this->record_ = local_30;
  goto LAB_0010686a;
}

Assistant:

bool BSTNode::erase(int key, Record*& r)
    {
        BSTNode* nd = search(key);
        if (!nd)
            return false;
        r = nd->record_;
        if (!nd->left_ && !nd->right_)
        {

            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nullptr;
            else
                nd->parent_->left_ = nullptr;
            delete nd;
        }
        else if (!nd->left_ && nd->right_)
        {
            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nd->right_;
            else
                nd->parent_->left_ = nd->right_;
            nd->right_->parent_ = nd->parent_;
            delete nd;
        }
        else if (nd->left_ && !nd->right_)
        {
            if (nd->key_ > nd->parent_->key_)
                nd->parent_->right_ = nd->left_;
            else
                nd->parent_->left_ = nd->left_;
            nd->left_->parent_ = nd->parent_;
            delete nd;
        }
        else
        {
            auto su = nd->successor();
            Record* r1 = nullptr;
            int kk = su->key_;
            nd->erase(su->key_, r1);
            nd->key_ = kk;
            nd->record_ = r1;
        }
        return true;
    }